

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O3

void __thiscall QTemporaryDirPrivate::create(QTemporaryDirPrivate *this,QString *templateName)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined1 *puVar4;
  int iVar5;
  int *piVar6;
  char cVar7;
  int iVar8;
  long in_FS_OFFSET;
  QFileSystemEntry fileSystemEntry;
  QString local_d8;
  NativePath local_c0;
  QTemporaryFileName local_a8;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QTemporaryFileName::QTemporaryFileName(&local_a8,templateName);
  iVar8 = 0x100;
  while( true ) {
    QTemporaryFileName::generateNext(&local_c0,&local_a8);
    if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_4_ = 0xaaaaaaaa;
    local_78._36_4_ = 0xaaaaaaaa;
    local_78._40_4_ = 0xaaaaaaaa;
    local_78._44_4_ = 0xaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_4_ = 0xaaaaaaaa;
    local_78._28_4_ = 0xaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,&local_a8);
    iVar5 = QFileSystemEngine::mkdir((char *)local_78,0x7000);
    if ((char)iVar5 == '\0') {
      piVar6 = __errno_location();
      cVar7 = (*piVar6 != 0x11) * '\x02';
    }
    else {
      this->success = true;
      QFileSystemEntry::filePath(&local_d8,(QFileSystemEntry *)local_78);
      pQVar1 = &((this->pathOrError).d.d)->super_QArrayData;
      pcVar2 = (this->pathOrError).d.ptr;
      (this->pathOrError).d.d = local_d8.d.d;
      (this->pathOrError).d.ptr = local_d8.d.ptr;
      qVar3 = (this->pathOrError).d.size;
      (this->pathOrError).d.size = local_d8.d.size;
      local_d8.d.d = (Data *)pQVar1;
      local_d8.d.ptr = pcVar2;
      local_d8.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      cVar7 = '\x01';
    }
    piVar6 = (int *)CONCAT44(local_78._28_4_,local_78._24_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78._28_4_,local_78._24_4_),1,0x10);
      }
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (cVar7 != '\0') break;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
LAB_00257fc6:
      qt_error_string((QString *)local_78,-1);
      pQVar1 = &((this->pathOrError).d.d)->super_QArrayData;
      pcVar2 = (this->pathOrError).d.ptr;
      (this->pathOrError).d.d = (Data *)local_78._0_8_;
      (this->pathOrError).d.ptr = (char16_t *)local_78._8_8_;
      puVar4 = (undefined1 *)(this->pathOrError).d.size;
      (this->pathOrError).d.size = local_78._16_8_;
      local_78._0_8_ = pQVar1;
      local_78._8_8_ = pcVar2;
      local_78._16_8_ = puVar4;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      this->success = false;
LAB_00258022:
      if (&(local_a8.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_a8.path.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
  if (cVar7 != '\x02') goto LAB_00258022;
  goto LAB_00257fc6;
}

Assistant:

void QTemporaryDirPrivate::create(const QString &templateName)
{
    QTemporaryFileName tfn(templateName);
    constexpr auto perms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    for (int i = 0; i < 256; ++i) {
        tfn.generateNext();
        QFileSystemEntry fileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
        if (QFileSystemEngine::mkdir(fileSystemEntry, perms)) {
            success = true;
            pathOrError = fileSystemEntry.filePath();
            return;
        }
#  ifdef Q_OS_WIN
        const int exists = ERROR_ALREADY_EXISTS;
        int code = GetLastError();
#  else
        const int exists = EEXIST;
        int code = errno;
#  endif
        if (code != exists)
            break;
    }
    pathOrError = qt_error_string();
    success = false;
}